

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O2

void __thiscall directory::split(directory *this,bucket *bucket,int bucket_no)

{
  uint32_t uVar1;
  undefined4 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined2 uVar5;
  uint uVar6;
  byte bVar7;
  allocator_type *__a;
  void *__buf;
  index *i;
  pointer piVar8;
  bucket *this_00;
  index index;
  bucket split_bucket;
  vector<index,_std::allocator<index>_> copy;
  string local_260;
  fstream splitBucketFile;
  
  uVar1 = this->depth;
  ::bucket::increaseDepth(bucket);
  uVar6 = ::bucket::getDepth(bucket);
  split_bucket.size = '\0';
  split_bucket.depth = 1;
  split_bucket.indices.super__Vector_base<index,_std::allocator<index>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  split_bucket.indices.super__Vector_base<index,_std::allocator<index>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  split_bucket.indices.super__Vector_base<index,_std::allocator<index>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  split_bucket.id = generateBucketId(&this->typeName);
  bVar7 = (byte)uVar1;
  split_bucket.depth = uVar6;
  if (this->depth < uVar6) {
    grow(this);
    (this->bucket_ids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[(1 << (bVar7 & 0x1f)) + bucket_no] = split_bucket.id;
  }
  else {
    uVar6 = (1 << (bVar7 - 1 & 0x1f)) + bucket_no;
    if (uVar6 < this->bucket_size) {
      bucket_no = uVar6;
    }
    (this->bucket_ids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[bucket_no] = split_bucket.id;
  }
  __a = (allocator_type *)&splitBucketFile;
  std::vector<index,std::allocator<index>>::
  vector<__gnu_cxx::__normal_iterator<index*,std::vector<index,std::allocator<index>>>,void>
            ((vector<index,std::allocator<index>> *)&copy,
             (bucket->indices).super__Vector_base<index,_std::allocator<index>_>._M_impl.
             super__Vector_impl_data._M_start,
             (bucket->indices).super__Vector_base<index,_std::allocator<index>_>._M_impl.
             super__Vector_impl_data._M_finish,__a);
  ::bucket::clear(bucket);
  for (piVar8 = copy.super__Vector_base<index,_std::allocator<index>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar8 != copy.super__Vector_base<index,_std::allocator<index>_>._M_impl.
                super__Vector_impl_data._M_finish; piVar8 = piVar8 + 1) {
    __a = (allocator_type *)
          (this->bucket_ids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_start;
    this_00 = &split_bucket;
    if ((*(uint32_t *)(__a + (ulong)(uint)(~(-1 << ((byte)this->depth & 0x1f)) & piVar8->value) * 4)
         == split_bucket.id) ||
       (this_00 = bucket,
       *(uint32_t *)(__a + (ulong)(uint)(~(-1 << ((byte)this->depth & 0x1f)) & piVar8->value) * 4)
       == bucket->id)) {
      uVar2 = piVar8->file_id;
      uVar3 = piVar8->page_id;
      uVar4 = piVar8->record_id;
      uVar5 = *(undefined2 *)&piVar8->field_0x6;
      index._6_2_ = uVar5;
      index.record_id = uVar4;
      index.page_id = uVar3;
      index.file_id = uVar2;
      index.value = piVar8->value;
      ::bucket::insert(this_00,index);
    }
    else {
      std::operator<<((ostream *)&std::cout,"error");
    }
  }
  generateBucketFileName(&local_260,&this->typeName,split_bucket.id);
  std::fstream::fstream(&splitBucketFile,(string *)&local_260,_S_out|_S_bin);
  std::__cxx11::string::~string((string *)&local_260);
  ::bucket::write(&split_bucket,(int)&splitBucketFile,__buf,(size_t)__a);
  std::fstream::~fstream(&splitBucketFile);
  std::_Vector_base<index,_std::allocator<index>_>::~_Vector_base
            (&copy.super__Vector_base<index,_std::allocator<index>_>);
  std::_Vector_base<index,_std::allocator<index>_>::~_Vector_base
            (&split_bucket.indices.super__Vector_base<index,_std::allocator<index>_>);
  return;
}

Assistant:

void directory::split(bucket &bucket, int bucket_no) {
    int local_depth, dir_depth = depth, pair_index;

    bucket.increaseDepth();

    local_depth = bucket.getDepth();

    class bucket split_bucket;

    split_bucket.id = generateBucketId(typeName);
    split_bucket.depth = local_depth;

    pair_index = pairIndex(bucket_no, local_depth);

    if(local_depth > depth) {
        grow();
        bucket_ids[bucket_no + (1 << dir_depth) ] = split_bucket.id;
    } else {
        if(bucket_no + (1 << (dir_depth - 1)) >= bucket_size) {

            bucket_ids[bucket_no ] = split_bucket.id;
        } else {

            bucket_ids[bucket_no + (1 << (dir_depth - 1)) ] = split_bucket.id;
        }
    }


    vector<index> copy = vector<index>(bucket.indices.begin(), bucket.indices.end());

    bucket.clear();

    for(auto &i: copy) {
        int _bucket_no = hash(i.value);

        if(bucket_ids[_bucket_no ] == split_bucket.id) {
            split_bucket.insert(i);
        } else if(bucket_ids[_bucket_no ] == bucket.id){
            bucket.insert(i);
        } else {
            cout << "error";
        }
    }

    fstream splitBucketFile(generateBucketFileName(typeName, split_bucket.id), OUTBIN);

    split_bucket.write(splitBucketFile);
}